

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

ll_elem * ll_pop_front(ll_head *q_head,int wait)

{
  ll_elem *plVar1;
  ll_head *e;
  ll_elem *n_;
  ll_elem *n;
  ll_elem *q;
  int wait_local;
  ll_head *q_head_local;
  
  do {
    plVar1 = succ(q_head,&q_head->q);
    n_ = ptr_clear(plVar1);
    if ((ll_head *)n_ == q_head) {
      deref_release(q_head,n_,1);
      return (ll_elem *)0x0;
    }
    do {
      plVar1 = ll_unlink(q_head,n_,wait);
      if (plVar1 != (ll_elem *)0x0) {
        return n_;
      }
      plVar1 = succ(q_head,n_);
      e = (ll_head *)ptr_clear(plVar1);
      deref_release(q_head,n_,1);
      n_ = (ll_elem *)e;
    } while (e != q_head);
    deref_release(q_head,(ll_elem *)e,1);
  } while( true );
}

Assistant:

struct ll_elem*
ll_pop_front(struct ll_head *q_head, int wait)
{
	struct ll_elem	*q, *n, *n_;

	q = &q_head->q;
	while ((n = ptr_clear(succ(q_head, q))) != q) {
		do {
			if (ll_unlink(q_head, n, wait))
				return n;
			n_ = n;
			n = ptr_clear(succ(q_head, n_));
			deref_release(q_head, n_, 1);
		} while (n != q);
		deref_release(q_head, n, 1);
	}
	deref_release(q_head, n, 1);
	return NULL;
}